

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_relation(compiler_state_t *cstate,int code,arth *a0,arth *a1,int reversed)

{
  block *b1;
  slist *s1;
  slist *s1_00;
  slist *s1_01;
  block *b1_00;
  block *extraout_RAX;
  block *pbVar1;
  slist *s0;
  slist *s0_00;
  bool bVar2;
  
  s1 = xfer_to_x(cstate,a1);
  s1_00 = xfer_to_a(cstate,a0);
  if (code == 0x10) {
    s1_01 = new_stmt(cstate,0x1c);
    b1_00 = new_block(cstate,0x15);
    sappend((slist *)b1_00,s1_01);
    pbVar1 = extraout_RAX;
  }
  else {
    pbVar1 = new_block(cstate,code | 0xd);
    b1_00 = pbVar1;
  }
  if (reversed != 0) {
    bVar2 = b1_00->sense == 0;
    pbVar1 = (block *)(ulong)bVar2;
    b1_00->sense = (uint)bVar2;
  }
  sappend((slist *)pbVar1,s1_00);
  sappend(s0,s1);
  sappend(s0_00,a1->s);
  b1_00->stmts = a0->s;
  cstate->regused[a0->regno] = 0;
  cstate->regused[a1->regno] = 0;
  pbVar1 = a0->b;
  b1 = a1->b;
  if (pbVar1 == (block *)0x0) {
    pbVar1 = b1;
    if (b1 == (block *)0x0) {
      return b1_00;
    }
  }
  else if (b1 != (block *)0x0) {
    gen_and(pbVar1,b1);
    pbVar1 = b1;
  }
  gen_and(pbVar1,b1_00);
  return b1_00;
}

Assistant:

struct block *
gen_relation(compiler_state_t *cstate, int code, struct arth *a0,
    struct arth *a1, int reversed)
{
	struct slist *s0, *s1, *s2;
	struct block *b, *tmp;

	s0 = xfer_to_x(cstate, a1);
	s1 = xfer_to_a(cstate, a0);
	if (code == BPF_JEQ) {
		s2 = new_stmt(cstate, BPF_ALU|BPF_SUB|BPF_X);
		b = new_block(cstate, JMP(code));
		sappend(s1, s2);
	}
	else
		b = new_block(cstate, BPF_JMP|code|BPF_X);
	if (reversed)
		gen_not(b);

	sappend(s0, s1);
	sappend(a1->s, s0);
	sappend(a0->s, a1->s);

	b->stmts = a0->s;

	free_reg(cstate, a0->regno);
	free_reg(cstate, a1->regno);

	/* 'and' together protocol checks */
	if (a0->b) {
		if (a1->b) {
			gen_and(a0->b, tmp = a1->b);
		}
		else
			tmp = a0->b;
	} else
		tmp = a1->b;

	if (tmp)
		gen_and(tmp, b);

	return b;
}